

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_33386e4::OriginPubkeyProvider::GetPubKey
          (OriginPubkeyProvider *this,int pos,SigningProvider *arg,CPubKey *key,KeyOriginInfo *info,
          DescriptorCache *read_cache,DescriptorCache *write_cache)

{
  long lVar1;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  uint uVar2;
  pointer pPVar3;
  uchar *__last;
  undefined8 in_RCX;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_RDX;
  uint in_ESI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  bool bVar4;
  uchar (*in_stack_00000008) [4];
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  *in_stack_ffffffffffffff68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  uchar *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffd0;
  const_iterator __position;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __position._M_current = (uint *)in_RDI;
  pPVar3 = std::
           unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
           ::operator->(in_stack_ffffffffffffff68);
  uVar2 = (*pPVar3->_vptr_PubkeyProvider[2])
                    (pPVar3,(ulong)in_ESI,in_RDX._M_current,in_RCX,in_R8,in_R9);
  bVar4 = (uVar2 & 1) != 0;
  if (bVar4) {
    __last = std::begin<unsigned_char_const,4ul>(in_stack_00000008);
    std::end<unsigned_char_const,4ul>(in_stack_00000008);
    std::copy<unsigned_char_const*,unsigned_char*>
              (in_stack_ffffffffffffff88,__last,
               (uchar *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_stack_ffffffffffffff70);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)in_stack_ffffffffffffff70);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_stack_ffffffffffffff70);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff70);
    __first._M_current._4_4_ = in_ESI;
    __first._M_current._0_4_ = in_stack_ffffffffffffffd0;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
              (in_RDI,__position,__first,in_RDX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool GetPubKey(int pos, const SigningProvider& arg, CPubKey& key, KeyOriginInfo& info, const DescriptorCache* read_cache = nullptr, DescriptorCache* write_cache = nullptr) const override
    {
        if (!m_provider->GetPubKey(pos, arg, key, info, read_cache, write_cache)) return false;
        std::copy(std::begin(m_origin.fingerprint), std::end(m_origin.fingerprint), info.fingerprint);
        info.path.insert(info.path.begin(), m_origin.path.begin(), m_origin.path.end());
        return true;
    }